

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void readData(string *filename,long *dataNumber,mydataFmt **pTeam,int length)

{
  mydataFmt *pmVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  string line;
  ifstream in;
  char *local_260;
  undefined8 local_258;
  char local_250;
  undefined7 uStack_24f;
  mydataFmt **local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  local_260 = &local_250;
  local_258 = 0;
  local_250 = '\0';
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    lVar7 = *dataNumber;
    lVar6 = 0;
    iVar8 = 0;
    local_240 = pTeam;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_260,cVar2);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      cVar2 = (char)(string *)&local_260;
      if (lVar6 < lVar7) {
        std::__cxx11::string::erase((ulong)&local_260,0);
        iVar3 = std::__cxx11::string::find(cVar2,0x5d);
        std::__cxx11::string::erase((ulong)&local_260,(long)iVar3);
        iVar3 = std::__cxx11::string::find(cVar2,0xd);
        if (iVar3 != -1) {
          std::__cxx11::string::erase((ulong)&local_260,(long)iVar3);
        }
        lVar9 = (long)iVar8;
      }
      else {
        iVar8 = iVar8 + 1;
        if (length != 0 && iVar8 == length) break;
        lVar9 = (long)iVar8;
        lVar7 = lVar7 + dataNumber[lVar9];
        std::__cxx11::string::erase((ulong)&local_260,0);
        iVar3 = std::__cxx11::string::find(cVar2,0x5d);
        std::__cxx11::string::erase((ulong)&local_260,(long)iVar3);
        iVar3 = std::__cxx11::string::find(cVar2,0xd);
        if (iVar3 != -1) {
          std::__cxx11::string::erase((ulong)&local_260,(long)iVar3);
        }
      }
      if (dataNumber[lVar9] != 0) {
        dVar10 = atof(local_260);
        pmVar1 = local_240[lVar9];
        local_240[lVar9] = pmVar1 + 1;
        *pmVar1 = (float)dVar10;
      }
      lVar6 = lVar6 + 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no such file",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void readData(string filename, long dataNumber[], mydataFmt *pTeam[], int length) {
    ifstream in(filename.data());
    string line;
    long temp = dataNumber[0];
    if (in) {
        int i = 0;
        int count = 0;
        int pos = 0;
        while (getline(in, line)) {
            try {
                if (i < temp) {
                    line.erase(0, 1);
                    pos = line.find(']');
                    line.erase(pos, 1);
                    pos = line.find('\r');
                    if (pos != -1) {
                        line.erase(pos, 1);
                    }
                    if (dataNumber[count] != 0) {
                        *(pTeam[count])++ = atof(line.data());
                    }
                } else {
                    count++;
                    if ((length != 0) && (count == length))
                        break;
                    temp += dataNumber[count];
                    line.erase(0, 1);
                    pos = line.find(']');
                    line.erase(pos, 1);
                    pos = line.find('\r');
                    if (pos != -1) {
                        line.erase(pos, 1);
                    }
                    if (dataNumber[count] != 0) {
                        *(pTeam[count])++ = atof(line.data());
                    }
                }
                i++;
            }
            catch (exception &e) {
                cout << " error " << i << endl;
                return;
            }
        }
    } else {
        cout << "no such file" << filename << endl;
    }
}